

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::
DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:2999:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
::
operator_Action<ot::commissioner::Error,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&>
::Op::~Op(Op *this)

{
  Op *this_local;
  
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  ::~Action(&this->last);
  std::
  vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
  ::~vector(&this->converted);
  return;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    struct Op {
      std::vector<Action<void(NonFinalType<Args>...)>> converted;
      Action<R(Args...)> last;
      R operator()(Args... args) const {
        auto tuple_args = std::forward_as_tuple(std::forward<Args>(args)...);
        for (auto& a : converted) {
          a.Perform(tuple_args);
        }
        return last.Perform(std::move(tuple_args));
      }
    };
    return Op{Convert<Action<void(NonFinalType<Args>...)>>(
                  MakeIndexSequence<sizeof...(Actions) - 1>()),
              std::get<sizeof...(Actions) - 1>(actions)};
  }